

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  ItemVector *pIVar3;
  size_type sVar4;
  ostream *poVar5;
  pointer pIVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  string config;
  ostringstream fout;
  string local_238;
  size_type *local_218;
  undefined8 local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pIVar3 = cmComputeLinkInformation::GetItems(cli);
  std::__cxx11::string::string((string *)&local_208,(string *)&cli->Config);
  pIVar6 = (pIVar3->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pIVar6 == (pIVar3->
                  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if (stdLibString->_M_string_length != 0) {
        poVar5 = std::operator<<(&local_1a8,(string *)stdLibString);
        std::operator<<(poVar5," ");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      return __return_storage_ptr__;
    }
    if ((pIVar6->Target != (cmGeneratorTarget *)0x0) &&
       (TVar2 = cmGeneratorTarget::GetType(pIVar6->Target), 1 < TVar2 - SHARED_LIBRARY)) {
      if (TVar2 == STATIC_LIBRARY) {
        this_00 = pIVar6->Target;
        std::__cxx11::string::string
                  ((string *)&local_238,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator *)&local_1e8);
        bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        if (!bVar1) goto LAB_003dc978;
      }
      else if (TVar2 != INTERFACE_LIBRARY) {
LAB_003dc978:
        local_238._M_string_length._0_4_ = 0;
        local_238.field_2._M_allocated_capacity = 0;
        local_238.field_2._8_8_ = &local_238._M_string_length;
        local_210 = 0;
        local_218 = (size_type *)local_238.field_2._8_8_;
        cmGeneratorTarget::GetLanguages
                  (pIVar6->Target,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238,&local_208);
        std::__cxx11::string::string((string *)&local_1e8,"CUDA",(allocator *)&local_1c8);
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_238,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        if (sVar4 != 0) {
          if (pIVar6->IsPath == true) {
            (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])(&local_1c8,this,pIVar6);
            cmLinkLineComputer::ConvertToOutputFormat
                      (&local_1e8,&this->super_cmLinkLineComputer,&local_1c8);
            std::operator<<(&local_1a8,(string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1c8);
          }
          else {
            std::operator<<(&local_1a8,(string *)pIVar6);
          }
          std::operator<<(&local_1a8," ");
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_238);
      }
    }
    pIVar6 = pIVar6 + 1;
  } while( true );
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  for (ItemVector::const_iterator li = items.begin(); li != items.end();
       ++li) {
    if (!li->Target) {
      continue;
    }

    bool skippable = false;
    switch (li->Target->GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::INTERFACE_LIBRARY:
        skippable = true;
        break;
      case cmStateEnums::STATIC_LIBRARY:
        // If a static library is resolving its device linking, it should
        // be removed for other device linking
        skippable =
          li->Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
        break;
      default:
        break;
    }

    if (skippable) {
      continue;
    }

    std::set<std::string> langs;
    li->Target->GetLanguages(langs, config);
    if (langs.count("CUDA") == 0) {
      continue;
    }

    if (li->IsPath) {
      fout << this->ConvertToOutputFormat(
        this->ConvertToLinkReference(li->Value));
    } else {
      fout << li->Value;
    }
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}